

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O1

bool __thiscall cmMakefile::PlatformIs32Bit(cmMakefile *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  string *psVar3;
  pointer pcVar4;
  string local_38;
  
  paVar1 = &local_38.field_2;
  local_38._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_38,"CMAKE_INTERNAL_PLATFORM_ABI","");
  psVar3 = GetDef(this,&local_38);
  if (psVar3 == (string *)0x0) {
    pcVar4 = (char *)0x0;
  }
  else {
    pcVar4 = (psVar3->_M_dataplus)._M_p;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  if ((pcVar4 == (char *)0x0) || (iVar2 = strcmp(pcVar4,"ELF X32"), iVar2 != 0)) {
    local_38._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"CMAKE_SIZEOF_VOID_P","");
    psVar3 = GetDef(this,&local_38);
    if (psVar3 == (string *)0x0) {
      pcVar4 = (char *)0x0;
    }
    else {
      pcVar4 = (psVar3->_M_dataplus)._M_p;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != paVar1) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
    if (pcVar4 != (char *)0x0) {
      iVar2 = atoi(pcVar4);
      return iVar2 == 4;
    }
  }
  return false;
}

Assistant:

bool cmMakefile::PlatformIs32Bit() const
{
  if (const char* plat_abi =
        this->GetDefinition("CMAKE_INTERNAL_PLATFORM_ABI")) {
    if (strcmp(plat_abi, "ELF X32") == 0) {
      return false;
    }
  }
  if (const char* sizeof_dptr = this->GetDefinition("CMAKE_SIZEOF_VOID_P")) {
    return atoi(sizeof_dptr) == 4;
  }
  return false;
}